

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

void __thiscall
Js::DynamicObject::ReplaceTypeWithPredecessorType(DynamicObject *this,DynamicType *predecessorType)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint16 uVar4;
  int iVar5;
  DynamicTypeHandler *pDVar6;
  undefined4 *puVar7;
  PathTypeHandlerBase *pPVar8;
  DynamicType *pDVar9;
  Type *this_00;
  RecyclableObject *pRVar10;
  RecyclableObject *pRVar11;
  DynamicTypeHandler *this_01;
  PathTypeHandlerBase *predecessorPathTypeHandler;
  PathTypeHandlerBase *currentPathTypeHandler;
  DynamicType *predecessorType_local;
  DynamicObject *this_local;
  
  pDVar6 = GetTypeHandler(this);
  iVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x178,"(this->GetTypeHandler()->IsPathTypeHandler())",
                                "this->GetTypeHandler()->IsPathTypeHandler()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pPVar8 = (PathTypeHandlerBase *)GetTypeHandler(this);
  pDVar9 = PathTypeHandlerBase::GetPredecessorType(pPVar8);
  pDVar6 = DynamicType::GetTypeHandler(pDVar9);
  iVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x179,
                                "(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler())"
                                ,
                                "((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pPVar8 = (PathTypeHandlerBase *)GetTypeHandler(this);
  pDVar9 = PathTypeHandlerBase::GetPredecessorType(pPVar8);
  if (pDVar9 != predecessorType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x17b,
                                "(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType() == predecessorType)"
                                ,
                                "((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType() == predecessorType"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = DynamicType::GetIsLocked(predecessorType);
  if (bVar2) {
    pDVar6 = DynamicType::GetTypeHandler(predecessorType);
    bVar2 = DynamicTypeHandler::GetIsLocked(pDVar6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x17d,
                                  "(!predecessorType->GetIsLocked() || predecessorType->GetTypeHandler()->GetIsLocked())"
                                  ,
                                  "!predecessorType->GetIsLocked() || predecessorType->GetTypeHandler()->GetIsLocked()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  bVar2 = DynamicType::GetIsShared(predecessorType);
  if (bVar2) {
    pDVar6 = DynamicType::GetTypeHandler(predecessorType);
    bVar2 = DynamicTypeHandler::GetIsShared(pDVar6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x17e,
                                  "(!predecessorType->GetIsShared() || predecessorType->GetTypeHandler()->GetIsShared())"
                                  ,
                                  "!predecessorType->GetIsShared() || predecessorType->GetTypeHandler()->GetIsShared()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  this_00 = RecyclableObject::GetType(&this->super_RecyclableObject);
  pRVar10 = Js::Type::GetPrototype(this_00);
  pRVar11 = Js::Type::GetPrototype(&predecessorType->super_Type);
  if (pRVar10 != pRVar11) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x180,
                                "(this->GetType()->GetPrototype() == predecessorType->GetPrototype())"
                                ,
                                "this->GetType()->GetPrototype() == predecessorType->GetPrototype()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pDVar6 = GetTypeHandler(this);
  this_01 = DynamicType::GetTypeHandler(predecessorType);
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(this_01);
  uVar4 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar6);
  if (uVar3 < uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x185,
                                "(predecessorPathTypeHandler->GetInlineSlotCapacity() >= currentPathTypeHandler->GetInlineSlotCapacity())"
                                ,
                                "predecessorPathTypeHandler->GetInlineSlotCapacity() >= currentPathTypeHandler->GetInlineSlotCapacity()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  Memory::WriteBarrierPtr<Js::Type>::operator=
            (&(this->super_RecyclableObject).type,&predecessorType->super_Type);
  return;
}

Assistant:

void DynamicObject::ReplaceTypeWithPredecessorType(DynamicType * predecessorType)
    {
        Assert(this->GetTypeHandler()->IsPathTypeHandler());
        Assert(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler());

        Assert(((PathTypeHandlerBase*)this->GetTypeHandler())->GetPredecessorType() == predecessorType);

        Assert(!predecessorType->GetIsLocked() || predecessorType->GetTypeHandler()->GetIsLocked());
        Assert(!predecessorType->GetIsShared() || predecessorType->GetTypeHandler()->GetIsShared());

        Assert(this->GetType()->GetPrototype() == predecessorType->GetPrototype());

        PathTypeHandlerBase* currentPathTypeHandler = (PathTypeHandlerBase*)this->GetTypeHandler();
        PathTypeHandlerBase* predecessorPathTypeHandler = (PathTypeHandlerBase*)predecessorType->GetTypeHandler();

        Assert(predecessorPathTypeHandler->GetInlineSlotCapacity() >= currentPathTypeHandler->GetInlineSlotCapacity());

        this->type = predecessorType;
    }